

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O1

bool __thiscall cmCTestCVS::LogParser::ProcessLine(LogParser *this)

{
  string *psVar1;
  RegularExpression *pRVar2;
  SectionType SVar3;
  bool bVar4;
  int iVar5;
  string local_40;
  
  psVar1 = &(this->super_LineParser).Line;
  iVar5 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar5 == 0) {
    if (this->Section == SectionRevisions) {
      FinishRevision(this);
    }
    this->Section = SectionEnd;
    goto LAB_002018f8;
  }
  iVar5 = std::__cxx11::string::compare((char *)psVar1);
  SVar3 = this->Section;
  if (iVar5 == 0) {
    if (SVar3 == SectionRevisions) {
      FinishRevision(this);
    }
    else if (SVar3 == SectionHeader) {
      this->Section = SectionRevisions;
    }
    goto LAB_002018f8;
  }
  if (SVar3 != SectionRevisions) goto LAB_002018f8;
  psVar1 = &(this->Rev).Log;
  if ((this->Rev).Log._M_string_length == 0) {
    if ((this->Rev).Rev._M_string_length == 0) {
      pRVar2 = &this->RegexRevision;
      bVar4 = cmsys::RegularExpression::find
                        (pRVar2,(this->super_LineParser).Line._M_dataplus._M_p,&pRVar2->regmatch);
      if (!bVar4) goto LAB_0020198c;
      cmsys::RegularExpression::match_abi_cxx11_(&local_40,pRVar2,1);
      std::__cxx11::string::operator=((string *)&this->Rev,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) goto LAB_002018f8;
LAB_00201a2a:
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      goto LAB_002018f8;
    }
LAB_0020198c:
    if ((this->Rev).Date._M_string_length == 0) {
      pRVar2 = &this->RegexPerson;
      bVar4 = cmsys::RegularExpression::find
                        (pRVar2,(this->super_LineParser).Line._M_dataplus._M_p,&pRVar2->regmatch);
      if (bVar4) {
        cmsys::RegularExpression::match_abi_cxx11_(&local_40,pRVar2,1);
        std::__cxx11::string::operator=((string *)&(this->Rev).Date,(string *)&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        cmsys::RegularExpression::match_abi_cxx11_(&local_40,pRVar2,2);
        std::__cxx11::string::operator=((string *)&(this->Rev).Author,(string *)&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p == &local_40.field_2) goto LAB_002018f8;
        goto LAB_00201a2a;
      }
    }
    bVar4 = cmsys::RegularExpression::find
                      (&this->RegexBranches,(this->super_LineParser).Line._M_dataplus._M_p,
                       &(this->RegexBranches).regmatch);
    if (bVar4) goto LAB_002018f8;
  }
  std::__cxx11::string::_M_append
            ((char *)psVar1,(ulong)(this->super_LineParser).Line._M_dataplus._M_p);
  std::__cxx11::string::push_back((char)psVar1);
LAB_002018f8:
  return this->Section != SectionEnd;
}

Assistant:

bool ProcessLine() override
  {
    if (this->Line ==
        ("======================================="
         "======================================")) {
      // This line ends the revision list.
      if (this->Section == SectionRevisions) {
        this->FinishRevision();
      }
      this->Section = SectionEnd;
    } else if (this->Line == "----------------------------") {
      // This line divides revisions from the header and each other.
      if (this->Section == SectionHeader) {
        this->Section = SectionRevisions;
      } else if (this->Section == SectionRevisions) {
        this->FinishRevision();
      }
    } else if (this->Section == SectionRevisions) {
      // XXX(clang-tidy): https://bugs.llvm.org/show_bug.cgi?id=44165
      // NOLINTNEXTLINE(bugprone-branch-clone)
      if (!this->Rev.Log.empty()) {
        // Continue the existing log.
        this->Rev.Log += this->Line;
        this->Rev.Log += '\n';
      } else if (this->Rev.Rev.empty() &&
                 this->RegexRevision.find(this->Line)) {
        this->Rev.Rev = this->RegexRevision.match(1);
      } else if (this->Rev.Date.empty() &&
                 this->RegexPerson.find(this->Line)) {
        this->Rev.Date = this->RegexPerson.match(1);
        this->Rev.Author = this->RegexPerson.match(2);
      } else if (!this->RegexBranches.find(this->Line)) {
        // Start the log.
        this->Rev.Log += this->Line;
        this->Rev.Log += '\n';
      }
    }
    return this->Section != SectionEnd;
  }